

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

int yaml_alias_event_initialize(yaml_event_t *event,yaml_char_t *anchor)

{
  size_t start;
  int iVar1;
  size_t length;
  yaml_char_t *pyVar2;
  yaml_char_t *anchor_copy;
  yaml_mark_t mark;
  yaml_char_t *anchor_local;
  yaml_event_t *event_local;
  
  mark.column = (size_t)anchor;
  memset(&anchor_copy,0,0x18);
  start = mark.column;
  if (event == (yaml_event_t *)0x0) {
    __assert_fail("event",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x322,"int yaml_alias_event_initialize(yaml_event_t *, yaml_char_t *)");
  }
  if (mark.column != 0) {
    length = strlen((char *)mark.column);
    iVar1 = yaml_check_utf8((yaml_char_t *)start,length);
    if (iVar1 == 0) {
      event_local._4_4_ = 0;
    }
    else {
      pyVar2 = yaml_strdup((yaml_char_t *)mark.column);
      if (pyVar2 == (yaml_char_t *)0x0) {
        event_local._4_4_ = 0;
      }
      else {
        memset(event,0,0x68);
        event->type = YAML_ALIAS_EVENT;
        (event->start_mark).index = (size_t)anchor_copy;
        (event->start_mark).line = mark.index;
        (event->start_mark).column = mark.line;
        (event->end_mark).index = (size_t)anchor_copy;
        (event->end_mark).line = mark.index;
        (event->end_mark).column = mark.line;
        (event->data).scalar.anchor = pyVar2;
        event_local._4_4_ = 1;
      }
    }
    return event_local._4_4_;
  }
  __assert_fail("anchor",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                ,0x323,"int yaml_alias_event_initialize(yaml_event_t *, yaml_char_t *)");
}

Assistant:

YAML_DECLARE(int)
yaml_alias_event_initialize(yaml_event_t *event, yaml_char_t *anchor)
{
    yaml_mark_t mark = { 0, 0, 0 };
    yaml_char_t *anchor_copy = NULL;

    assert(event);      /* Non-NULL event object is expected. */
    assert(anchor);     /* Non-NULL anchor is expected. */

    if (!yaml_check_utf8(anchor, strlen((char *)anchor))) return 0;

    anchor_copy = yaml_strdup(anchor);
    if (!anchor_copy)
        return 0;

    ALIAS_EVENT_INIT(*event, anchor_copy, mark, mark);

    return 1;
}